

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O3

void __thiscall CVmObjGramProd::notify_delete(CVmObjGramProd *this,int param_1)

{
  void *__ptr;
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 *__ptr_00;
  char *pcVar3;
  
  pcVar3 = (this->super_CVmObject).ext_;
  if (pcVar3 == (char *)0x0) {
    return;
  }
  __ptr = *(void **)(pcVar3 + 0x30);
  if (__ptr != (void *)0x0) {
    clear_alts(this);
    free(__ptr);
    pcVar3 = (this->super_CVmObject).ext_;
  }
  puVar1 = *(undefined8 **)(pcVar3 + 0x18);
  if (puVar1 != (undefined8 *)0x0) {
    __ptr_00 = (undefined8 *)*puVar1;
    while (__ptr_00 != (undefined8 *)0x0) {
      puVar2 = (undefined8 *)*__ptr_00;
      free(__ptr_00);
      *puVar1 = puVar2;
      __ptr_00 = puVar2;
    }
  }
  operator_delete(puVar1,0x20);
  free(*(void **)((this->super_CVmObject).ext_ + 0x20));
  (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])(G_mem_X->varheap_,(this->super_CVmObject).ext_);
  return;
}

Assistant:

void CVmObjGramProd::notify_delete(VMG_ int /*in_root_set*/)
{
    /* free our additional data */
    if (ext_ != 0)
    {
        /* if we've allocated alternatives, delete them */
        vmgram_alt_info **alts = get_ext()->alts_;
        if (alts != 0)
        {
            /* delete the alternative objects */
            clear_alts();

            /* free the alternative array itself */
            t3free(alts);
        }

        /* delete our memory pool */
        delete get_ext()->mem_;

        /* delete our property enumeration space */
        t3free(get_ext()->prop_enum_arr_);
        
        /* free the extension */
        G_mem->get_var_heap()->free_mem(ext_);
    }
}